

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O1

int MPIABI_Type_create_indexed_block
              (int count,int blocklength,int *array_of_displacements,MPIABI_Datatype oldtype,
              MPIABI_Datatype *newtype)

{
  int iVar1;
  
  iVar1 = MPI_Type_create_indexed_block();
  return iVar1;
}

Assistant:

int MPIABI_Type_create_indexed_block(
  int count,
  int blocklength,
  const int * array_of_displacements,
  MPIABI_Datatype oldtype,
  MPIABI_Datatype * newtype
) {
  return MPI_Type_create_indexed_block(
    count,
    blocklength,
    array_of_displacements,
    (MPI_Datatype)(WPI_Datatype)oldtype,
    (MPI_Datatype *)(WPI_DatatypePtr)newtype
  );
}